

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_xc_1d_ehwlrg.c
# Opt level: O2

void lda_xc_1d_ehwlrg_init(xc_func_type *p)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 *puVar4;
  uint uVar5;
  ulong uVar6;
  
  puVar4 = (undefined8 *)malloc(0x20);
  p->params = puVar4;
  uVar5 = p->info->number - 0x218;
  if (uVar5 < 3) {
    uVar6 = (ulong)uVar5;
    uVar1 = *(undefined8 *)(&DAT_0101cfe0 + uVar6 * 8);
    uVar2 = *(undefined8 *)(&DAT_0101cff8 + uVar6 * 8);
    uVar3 = *(undefined8 *)(&DAT_0101d010 + uVar6 * 8);
    *puVar4 = *(undefined8 *)(&DAT_0101cfc8 + uVar6 * 8);
    puVar4[1] = uVar1;
    puVar4[2] = uVar2;
    puVar4[3] = uVar3;
  }
  return;
}

Assistant:

static void
lda_xc_1d_ehwlrg_init(xc_func_type *p)
{
  lda_xc_1d_ehwlrg_params *params;

  assert(p!=NULL && p->params == NULL);
  p->params = libxc_malloc(sizeof(lda_xc_1d_ehwlrg_params));
  params = (lda_xc_1d_ehwlrg_params *) (p->params);

  switch(p->info->number){
  case XC_LDA_XC_1D_EHWLRG_1:
    params->alpha =  0.638;
    params->a1    = -0.803;
    params->a2    =  0.82;
    params->a3    = -0.47;
    break;
  case XC_LDA_XC_1D_EHWLRG_2:
    params->alpha =  0.604;
    params->a1    = -0.74;
    params->a2    =  0.68;
    params->a3    = -0.38;
    break;
  case XC_LDA_XC_1D_EHWLRG_3:
    params->alpha =  0.61;
    params->a1    = -0.77;
    params->a2    =  0.79;
    params->a3    = -0.48;
    break;
  }
}